

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrADC0x6d(CPU *this)

{
  Memory *this_00;
  uint8_t argument;
  uint16_t uVar1;
  
  this_00 = this->m;
  uVar1 = this->PC;
  this->PC = uVar1 + 2;
  uVar1 = Memory::Read16(this_00,uVar1);
  argument = Memory::Read8(this_00,uVar1);
  ADC(this,argument);
  return 4;
}

Assistant:

int CPU::instrADC0x6d() {
	ADC(absolute_addr());
	return 4;
}